

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

void __thiscall sqvector<SQObjectPtr>::~sqvector(sqvector<SQObjectPtr> *this)

{
  long lVar1;
  ulong uVar2;
  
  if (this->_allocated != 0) {
    if (this->_size != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(this->_vals->super_SQObject)._type + lVar1));
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (uVar2 < this->_size);
    }
    sq_vm_free(this->_vals,this->_allocated << 4);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }